

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

void base64_stream_decode_init(base64_state *state,int flags)

{
  if (((char)flags != '\0') ||
     (codec.dec == (_func_int_base64_state_ptr_char_ptr_size_t_char_ptr_size_t_ptr *)0x0)) {
    codec_choose(&codec,flags);
  }
  state->eof = 0;
  state->bytes = 0;
  state->carry = '\0';
  state->flags = flags;
  return;
}

Assistant:

void
base64_stream_decode_init (struct base64_state *state, int flags)
{
	// If any of the codec flags are set, redo choice:
	if (codec.dec == NULL || flags & 0xFF) {
		codec_choose(&codec, flags);
	}
	state->eof = 0;
	state->bytes = 0;
	state->carry = 0;
	state->flags = flags;
}